

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f Quat4f::slerp(Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  float fVar6;
  byte in_CL;
  undefined7 in_register_00000011;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined1 in_register_00001204 [60];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  Quat4f QVar17;
  undefined1 extraout_var [56];
  
  auVar14._4_60_ = in_register_00001204;
  auVar14._0_4_ = t;
  pfVar4 = (float *)CONCAT71(in_register_00000011,allowFlip);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(b->m_elements[1] *
                                          *(float *)(CONCAT71(in_register_00000011,allowFlip) + 4)))
                            ,ZEXT416((uint)b->m_elements[0]),
                            ZEXT416(*(uint *)CONCAT71(in_register_00000011,allowFlip)));
  auVar16 = vfmadd132ss_fma(ZEXT416((uint)b->m_elements[2]),auVar16,
                            ZEXT416(*(uint *)(CONCAT71(in_register_00000011,allowFlip) + 8)));
  auVar16 = vfmadd132ss_fma(ZEXT416((uint)b->m_elements[3]),auVar16,
                            ZEXT416(*(uint *)(CONCAT71(in_register_00000011,allowFlip) + 0xc)));
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar16,auVar8);
  if (0.009999999776482582 <= 1.0 - (double)auVar8._0_4_) {
    dVar12 = acos((double)auVar8._0_4_);
    fVar10 = (float)dVar12;
    dVar12 = sin((double)fVar10);
    dVar13 = sin((double)((1.0 - t) * fVar10));
    auVar15._0_8_ = sin((double)(fVar10 * t));
    auVar15._8_56_ = extraout_var;
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_8_ = dVar13;
    auVar8 = vunpcklpd_avx(auVar15._0_16_,auVar1);
    auVar9._8_8_ = (double)(float)dVar12;
    auVar9._0_8_ = (double)(float)dVar12;
    auVar8 = vdivpd_avx(auVar8,auVar9);
    auVar8 = vcvtpd2ps_avx(auVar8);
  }
  else {
    auVar8 = vinsertps_avx(auVar14._0_16_,ZEXT416((uint)(1.0 - t)),0x10);
  }
  auVar1 = vmovshdup_avx(auVar8);
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(auVar1,auVar5);
  uVar2 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x40,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  iVar7 = (uint)bVar3 * ((uint)(in_CL & 1) * auVar9._0_4_ + (uint)!(bool)(in_CL & 1) * auVar1._0_4_)
          + (uint)!bVar3 * auVar1._0_4_;
  fVar11 = auVar8._0_4_;
  fVar10 = *pfVar4;
  fVar6 = pfVar4[1];
  auVar16._4_4_ = iVar7;
  auVar16._0_4_ = iVar7;
  auVar16._8_4_ = iVar7;
  auVar16._12_4_ = iVar7;
  auVar16 = vfmadd132ps_fma(auVar16,CONCAT412(fVar11 * pfVar4[3],
                                              CONCAT48(fVar11 * pfVar4[2],
                                                       CONCAT44(fVar11 * fVar6,fVar11 * fVar10))),
                            *(undefined1 (*) [16])b->m_elements);
  *(undefined1 (*) [16])a->m_elements = auVar16;
  QVar17.m_elements._8_8_ = auVar16._0_8_;
  QVar17.m_elements[0] = fVar11 * fVar10;
  QVar17.m_elements[1] = fVar11 * fVar6;
  return (Quat4f)QVar17.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}